

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O2

void armci_init_domains(MPI_Comm comm)

{
  char *__s;
  bool bVar1;
  int iVar2;
  int iVar3;
  char *__s1;
  int *piVar4;
  size_t sVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  int size;
  int local_154;
  int rank;
  int namelen;
  char *local_148;
  MPI_Comm local_140;
  char name [256];
  
  iVar2 = MPI_Comm_rank(comm,&rank);
  if (iVar2 == 0) {
    iVar2 = MPI_Comm_size(comm,&size);
    if (iVar2 == 0) {
      lVar10 = (long)size;
      __s1 = (char *)malloc(lVar10 << 8);
      piVar4 = (int *)malloc(lVar10 << 2);
      MPI_Get_processor_name(name,&namelen);
      local_140 = comm;
      iVar2 = MPI_Allgather(name,0x100,&ompi_mpi_char,__s1,0x100,&ompi_mpi_char,comm);
      if (iVar2 == 0) {
        *piVar4 = 1;
        uVar8 = 0;
        local_154 = size;
        iVar7 = 1;
        local_148 = __s1;
        for (iVar2 = 1; iVar2 < local_154; iVar2 = iVar2 + 1) {
          __s = __s1 + 0x100;
          sVar5 = strlen(__s);
          namelen = (int)sVar5;
          iVar3 = strncmp(__s1,__s,(long)namelen);
          lVar10 = (long)(int)uVar8;
          if (iVar3 == 0) {
            iVar7 = iVar7 + 1;
          }
          else {
            piVar4[lVar10 + 1] = 0;
            uVar8 = uVar8 + 1;
            lVar10 = lVar10 + 1;
            iVar7 = 1;
          }
          piVar4[lVar10] = iVar7;
          __s1 = __s;
        }
        _number_of_procs_per_node = *piVar4;
        if ((int)uVar8 < 1) {
          uVar8 = 0;
        }
        bVar1 = true;
        for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
          if (piVar4[uVar9 + 1] != _number_of_procs_per_node) {
            bVar1 = false;
          }
        }
        if (bVar1) {
          rank = rank / _number_of_procs_per_node;
        }
        else {
          _number_of_procs_per_node = 1;
        }
        _my_node_id = rank;
        free(local_148);
        free(piVar4);
        iVar7 = MPI_Barrier(local_140);
        iVar2 = _number_of_procs_per_node;
        if (iVar7 == 0) {
          uVar9 = (ulong)(uint)_number_of_procs_per_node;
          if (1 < _number_of_procs_per_node) {
            piVar4 = (int *)malloc(uVar9 * 4);
            iVar7 = _my_node_id * iVar2;
            for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
              piVar4[uVar6] = iVar7 + (int)uVar6;
            }
            comex_group_create(iVar2,piVar4,0,&ARMCI_Node_group);
            free(piVar4);
          }
          return;
        }
        uVar8 = 0x56;
      }
      else {
        uVar8 = 0x2d;
      }
    }
    else {
      uVar8 = 0x24;
    }
  }
  else {
    uVar8 = 0x22;
  }
  __assert_fail("MPI_SUCCESS == status",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                ,uVar8,"void armci_init_domains(MPI_Comm)");
}

Assistant:

void armci_init_domains(MPI_Comm comm)
{
  int i, status;
  char name[MPI_MAX_PROCESSOR_NAME];
  char *namebuf, *buf_ptr, *prev_ptr;
  int namelen, rank, size, nprocs;
  int *nodeid, *nodesize;
  int ncnt;

  status = MPI_Comm_rank(comm, &rank);
  assert(MPI_SUCCESS == status);
  status = MPI_Comm_size(comm, &size);
  assert(MPI_SUCCESS == status);

  /* determine number of processors per node. First find node name */
  namebuf = (char*)malloc(MPI_MAX_PROCESSOR_NAME*size*sizeof(char));
  nodeid = (int*)malloc(size*sizeof(int));
  nodesize = (int*)malloc(size*sizeof(int));
  MPI_Get_processor_name(name, &namelen);
  status = MPI_Allgather(name,MPI_MAX_PROCESSOR_NAME,MPI_CHAR,namebuf,
      MPI_MAX_PROCESSOR_NAME,MPI_CHAR,comm);
  assert(MPI_SUCCESS == status);

  /* Bin all processors with the same node name */
  ncnt = 0;
  nodeid[0] = ncnt;
  nodesize[0] = 1;
  prev_ptr = namebuf;
  buf_ptr = namebuf+MPI_MAX_PROCESSOR_NAME;
  for (i=1; i<size; i++) {
    namelen = strlen(buf_ptr);
    if (strncmp(prev_ptr,buf_ptr,namelen) != 0) {
      ncnt++;
      nodesize[ncnt]=0;
    }
    nodeid[i] = ncnt;
    nodesize[ncnt]++;
    prev_ptr += MPI_MAX_PROCESSOR_NAME;
    buf_ptr += MPI_MAX_PROCESSOR_NAME;
  }
  ncnt++;
  /* check to see if all nodes have the same number of processors */
  status = 1;
  nprocs = nodesize[0];
  for (i=1; i<ncnt; i++) {
    if (nodesize[i] != nprocs) status = 0;
  }
  /* uneven number of processors per node so bail out and assume each
   * processor is a node */
  if (!status) {
    _number_of_procs_per_node = 1;
    _my_node_id = rank;
  } else {
    /* Same number of processors for all nodes so set domain variables */
    _number_of_procs_per_node = nprocs;
    _my_node_id = rank/_number_of_procs_per_node;
  }

  free(namebuf);
  free(nodeid);
  free(nodesize);
  status = MPI_Barrier(comm);
  assert(MPI_SUCCESS == status);
  /* Create a comex group on the node */
  if (_number_of_procs_per_node > 1) {
    int *nodelist = (int*)malloc(_number_of_procs_per_node*sizeof(int));
    for (i=0; i<_number_of_procs_per_node; i++)
      nodelist[i] = _my_node_id*_number_of_procs_per_node+i;
    comex_group_create(_number_of_procs_per_node, nodelist,
        COMEX_GROUP_WORLD, &ARMCI_Node_group);
    free(nodelist);
  }
}